

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AEAD_Poly1305_64.c
# Opt level: O2

void Hacl_Impl_Poly1305_64_poly1305_last_pass(uint64_t *acc)

{
  uint64_t x;
  long lVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint64_t x_00;
  
  for (lVar1 = 1; lVar1 != 3; lVar1 = lVar1 + 1) {
    uVar2 = acc[lVar1 + -1];
    acc[lVar1 + -1] = uVar2 & 0xfffffffffff;
    acc[lVar1] = acc[lVar1] + (uVar2 >> 0x2c);
  }
  Hacl_Bignum_Modulo_carry_top(acc);
  uVar2 = (*acc >> 0x2c) + acc[1];
  *acc = *acc & 0xfffffffffff;
  acc[1] = uVar2 & 0xfffffffffff;
  acc[2] = acc[2] + (uVar2 >> 0x2c);
  Hacl_Bignum_Modulo_carry_top(acc);
  x = acc[2];
  uVar5 = *acc & 0xfffffffffff;
  x_00 = (*acc >> 0x2c) + acc[1];
  uVar3 = FStar_UInt64_eq_mask(x_00,0xfffffffffff);
  uVar4 = FStar_UInt64_eq_mask(x,0x3ffffffffff);
  uVar2 = 0;
  if (0xffffffffffa < uVar5) {
    uVar2 = uVar3;
  }
  uVar2 = uVar2 & uVar4;
  *acc = uVar5 - (uVar2 & 0xffffffffffb);
  acc[1] = x_00 - (uVar2 & 0xfffffffffff);
  acc[2] = x - (uVar2 & 0x3ffffffffff);
  return;
}

Assistant:

static void Hacl_Impl_Poly1305_64_poly1305_last_pass(uint64_t *acc)
{
  Hacl_Bignum_Fproduct_carry_limb_(acc);
  Hacl_Bignum_Modulo_carry_top(acc);
  uint64_t a0 = acc[0U];
  uint64_t a10 = acc[1U];
  uint64_t a20 = acc[2U];
  uint64_t a0_ = a0 & (uint64_t)0xfffffffffffU;
  uint64_t r0 = a0 >> (uint32_t)44U;
  uint64_t a1_ = (a10 + r0) & (uint64_t)0xfffffffffffU;
  uint64_t r1 = (a10 + r0) >> (uint32_t)44U;
  uint64_t a2_ = a20 + r1;
  acc[0U] = a0_;
  acc[1U] = a1_;
  acc[2U] = a2_;
  Hacl_Bignum_Modulo_carry_top(acc);
  uint64_t i0 = acc[0U];
  uint64_t i1 = acc[1U];
  uint64_t i0_ = i0 & (uint64_t)0xfffffffffffU;
  uint64_t i1_ = i1 + (i0 >> (uint32_t)44U);
  acc[0U] = i0_;
  acc[1U] = i1_;
  uint64_t a00 = acc[0U];
  uint64_t a1 = acc[1U];
  uint64_t a2 = acc[2U];
  uint64_t mask0 = FStar_UInt64_gte_mask(a00, (uint64_t)0xffffffffffbU);
  uint64_t mask1 = FStar_UInt64_eq_mask(a1, (uint64_t)0xfffffffffffU);
  uint64_t mask2 = FStar_UInt64_eq_mask(a2, (uint64_t)0x3ffffffffffU);
  uint64_t mask = (mask0 & mask1) & mask2;
  uint64_t a0_0 = a00 - ((uint64_t)0xffffffffffbU & mask);
  uint64_t a1_0 = a1 - ((uint64_t)0xfffffffffffU & mask);
  uint64_t a2_0 = a2 - ((uint64_t)0x3ffffffffffU & mask);
  acc[0U] = a0_0;
  acc[1U] = a1_0;
  acc[2U] = a2_0;
}